

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void mc_abi_add(mc_abi *m1,mc_abi *m2,mc_abi *r)

{
  mc_abi *r_local;
  mc_abi *m2_local;
  mc_abi *m1_local;
  
  if (m1 == (mc_abi *)0x0) {
    __assert_fail("m1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x1ee,
                  "void mc_abi_add(const struct mc_abi *, const struct mc_abi *, struct mc_abi *)");
  }
  if (m2 != (mc_abi *)0x0) {
    if (r != (mc_abi *)0x0) {
      la_dgeadd_os(3,3,(double *)m1,3,(double *)m2,3,(double *)r,3);
      la_dgeadd_os(3,3,(double *)&m1->first_moment_of_mass,3,(double *)&m2->first_moment_of_mass,3,
                   (double *)&r->first_moment_of_mass,3);
      la_dgeadd_os(3,3,(double *)&m1->second_moment_of_mass,3,(double *)&m2->second_moment_of_mass,3
                   ,(double *)&r->second_moment_of_mass,3);
      return;
    }
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x1f0,
                  "void mc_abi_add(const struct mc_abi *, const struct mc_abi *, struct mc_abi *)");
  }
  __assert_fail("m2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x1ef,
                "void mc_abi_add(const struct mc_abi *, const struct mc_abi *, struct mc_abi *)");
}

Assistant:

void mc_abi_add(
        const struct mc_abi *m1,
        const struct mc_abi *m2,
        struct mc_abi *r)
{
    assert(m1);
    assert(m2);
    assert(r);

    la_dgeadd_os(3, 3,
            (double *)&m1->zeroth_moment_of_mass, 3,
            (double *)&m2->zeroth_moment_of_mass, 3,
            (double *)&r->zeroth_moment_of_mass, 3);
    la_dgeadd_os(3, 3,
            (double *)&m1->first_moment_of_mass, 3,
            (double *)&m2->first_moment_of_mass, 3,
            (double *)&r->first_moment_of_mass, 3);
    la_dgeadd_os(3, 3,
            (double *)&m1->second_moment_of_mass, 3,
            (double *)&m2->second_moment_of_mass, 3,
            (double *)&r->second_moment_of_mass, 3);
}